

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

CHAR LocalRegionGrayValue6redict65(IplImage *pImage)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  UINT local_438;
  int best_threshold;
  UINT count_of_gray [256];
  INT32U white_to_black;
  INT32U is_white;
  INT32U sum_value;
  INT32U locate_value;
  INT32U col;
  INT32U row;
  IplImage *pImage_local;
  
  bVar2 = false;
  bVar1 = false;
  memset(&local_438,0,0x400);
  for (locate_value = 6; locate_value < 0xe; locate_value = locate_value + 1) {
    for (sum_value = 1; sum_value < 7; sum_value = sum_value + 1) {
      (&local_438)[pImage->imageData[locate_value * pImage->widthStep + sum_value]] =
           (&local_438)[pImage->imageData[locate_value * pImage->widthStep + sum_value]] + 1;
    }
  }
  uVar3 = get_best_threshold(&local_438);
  locate_value = 6;
  while( true ) {
    if (0xd < locate_value) {
      if (bVar2) {
        pImage_local._7_1_ = '6';
      }
      else {
        pImage_local._7_1_ = '5';
      }
      return pImage_local._7_1_;
    }
    white_to_black = 0;
    for (sum_value = 1; sum_value < 7; sum_value = sum_value + 1) {
      is_white = (INT32U)(pImage->imageData[locate_value * pImage->widthStep + sum_value] <= uVar3);
      white_to_black = is_white + white_to_black;
    }
    if ((bVar1) && (white_to_black != 0)) break;
    if ((bVar2) && (white_to_black == 0)) {
      bVar1 = true;
    }
    if (white_to_black != 0) {
      bVar2 = true;
    }
    locate_value = locate_value + 1;
  }
  return '5';
}

Assistant:

CHAR LocalRegionGrayValue6redict65(IplImage *pImage) {
    INT32U row, col, locate_value, sum_value = 0;
    INT32U is_white = 0, white_to_black = 0;

    //    区域 [6:14,1:7]
    UINT count_of_gray[256] = {0};
    int best_threshold;

    for (row = 6; row < 14; row++) {
        for (col = 1; col < 7; col++) {
            // get the pixel,
            locate_value = pImage->imageData[row * pImage->widthStep + col];
            count_of_gray[locate_value] += 1;

        }
    }
    //    寻找 最优 二值化 阈值
    best_threshold = get_best_threshold(count_of_gray);

    for (row = 6; row < 14; row++) {
//        计算这一行 二值化后 灰度值大小
        sum_value = 0;
        for (col = 1; col < 7; col++) {
            // get the pixel
            locate_value = pImage->imageData[row * pImage->widthStep + col];
//            二值化,背景是黑色（0），前景是白色（1）
            if (locate_value <= best_threshold)
                locate_value = 1;
            else
                locate_value = 0;

            sum_value += locate_value;
        }

        if (white_to_black == 1 && sum_value > 0) {
//            白转黑 又转白
            return '5';
        }

        if (is_white == 1 && sum_value == 0) {
//            白转黑
            white_to_black = 1;
        }

        if (sum_value > 0)
            is_white = 1;

    }

    if (is_white == 0)
//        非环
        return '5';
    else
        return '6';
}